

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O2

void amrex::sum_fine_to_coarse
               (MultiFab *S_fine,MultiFab *S_crse,int scomp,int ncomp,IntVect *ratio,Geometry *cgeom
               ,Geometry *param_7)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int ngrow;
  int iVar15;
  ulong uVar16;
  bool bVar17;
  double dVar18;
  Periodicity PVar19;
  int facx;
  int kk;
  Box local_314;
  Array4<double> local_2f8;
  Array4<const_double> local_2b8;
  MFIter mfi;
  BoxArray crse_S_fine_BA;
  MultiFab crse_S_fine;
  
  ngrow = (S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] /
          ratio->vect[0];
  BoxArray::BoxArray(&crse_S_fine_BA,
                     &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
  BoxArray::coarsen(&crse_S_fine_BA,ratio);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
  mfi.fabArray._0_4_ = 0;
  mfi.fabArray._4_4_ = 0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  local_2f8.p = (double *)&PTR__FabFactory_007d2928;
  MultiFab::MultiFab(&crse_S_fine,&crse_S_fine_BA,
                     &(S_fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                     ncomp,ngrow,(MFInfo *)&mfi,(FabFactory<amrex::FArrayBox> *)&local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  MFIter::MFIter(&mfi,(FabArrayBase *)&crse_S_fine,true);
  uVar5 = 0;
  if (0 < ncomp) {
    uVar5 = (ulong)(uint)ncomp;
  }
  while (mfi.currentIndex < mfi.endIndex) {
    MFIter::growntilebox(&local_314,&mfi,ngrow);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_2f8,&crse_S_fine.super_FabArray<amrex::FArrayBox>,&mfi);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_2b8,&S_fine->super_FabArray<amrex::FArrayBox>,&mfi);
    for (uVar10 = 0; uVar10 != uVar5; uVar10 = uVar10 + 1) {
      for (iVar8 = local_314.smallend.vect[2]; iVar8 <= local_314.bigend.vect[2]; iVar8 = iVar8 + 1)
      {
        uVar1 = ratio->vect[0];
        uVar2 = ratio->vect[1];
        uVar3 = ratio->vect[2];
        uVar16 = 0;
        if (0 < (int)uVar1) {
          uVar16 = (ulong)uVar1;
        }
        uVar14 = 0;
        if (0 < (int)uVar2) {
          uVar14 = (ulong)uVar2;
        }
        uVar4 = uVar3;
        if ((int)uVar3 < 1) {
          uVar4 = 0;
        }
        for (lVar6 = (long)local_314.smallend.vect[1]; lVar6 <= local_314.bigend.vect[1];
            lVar6 = lVar6 + 1) {
          if (local_314.smallend.vect[0] <= local_314.bigend.vect[0]) {
            lVar9 = (long)local_314.smallend.vect[0];
            iVar7 = local_314.smallend.vect[0] * uVar1;
            do {
              dVar18 = 0.0;
              for (uVar11 = 0; uVar11 != uVar4; uVar11 = uVar11 + 1) {
                for (uVar12 = 0; uVar12 != uVar14; uVar12 = uVar12 + 1) {
                  uVar13 = uVar16;
                  iVar15 = iVar7 - local_2b8.begin.x;
                  while (bVar17 = uVar13 != 0, uVar13 = uVar13 - 1, bVar17) {
                    dVar18 = dVar18 + local_2b8.p
                                      [local_2b8.nstride * ((long)scomp + uVar10) +
                                       (int)((uVar3 * iVar8 + (int)uVar11) - local_2b8.begin.z) *
                                       local_2b8.kstride +
                                       (int)(((int)lVar6 * uVar2 + (int)uVar12) - local_2b8.begin.y)
                                       * local_2b8.jstride + (long)iVar15];
                    iVar15 = iVar15 + 1;
                  }
                }
              }
              local_2f8.p
              [((long)iVar8 - (long)local_2f8.begin.z) * local_2f8.kstride +
               local_2f8.nstride * uVar10 +
               (lVar6 - local_2f8.begin.y) * local_2f8.jstride + (lVar9 - local_2f8.begin.x)] =
                   (double)(dVar18 * (1.0 / (double)(int)(uVar2 * uVar1 * uVar3)));
              lVar9 = lVar9 + 1;
              iVar7 = iVar7 + uVar1;
            } while (local_314.bigend.vect[0] + 1 != (int)lVar9);
          }
        }
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  PVar19 = Geometry::periodicity(cgeom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
       (undefined1)PVar19.period.vect[0];
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = PVar19.period.vect._1_7_;
  mfi.fabArray._0_4_ = PVar19.period.vect[2];
  FabArray<amrex::FArrayBox>::ParallelCopy
            (&S_crse->super_FabArray<amrex::FArrayBox>,&crse_S_fine.super_FabArray<amrex::FArrayBox>
             ,0,scomp,ncomp,ngrow,0,(Periodicity *)&mfi,ADD);
  MultiFab::~MultiFab(&crse_S_fine);
  BoxArray::~BoxArray(&crse_S_fine_BA);
  return;
}

Assistant:

void sum_fine_to_coarse(const MultiFab& S_fine, MultiFab& S_crse,
                            int scomp, int ncomp, const IntVect& ratio,
                            const Geometry& cgeom, const Geometry& /*fgeom*/)
    {
        AMREX_ASSERT(S_crse.nComp() == S_fine.nComp());
        AMREX_ASSERT(ratio == ratio[0]);
        AMREX_ASSERT(S_fine.nGrow() % ratio[0] == 0);

        const int nGrow = S_fine.nGrow() / ratio[0];

        //
        // Coarsen() the fine stuff on processors owning the fine data.
        //
        BoxArray crse_S_fine_BA = S_fine.boxArray(); crse_S_fine_BA.coarsen(ratio);

        MultiFab crse_S_fine(crse_S_fine_BA, S_fine.DistributionMap(), ncomp, nGrow, MFInfo(), FArrayBoxFactory());

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && crse_S_fine.isFusingCandidate()) {
            auto const& crsema = crse_S_fine.arrays();
            auto const& finema = S_fine.const_arrays();
            ParallelFor(crse_S_fine, IntVect(nGrow), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                amrex_avgdown(i,j,k,n,crsema[box_no],finema[box_no],0,scomp,ratio);
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(crse_S_fine, TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                //  NOTE: The tilebox is defined at the coarse level.
                const Box& bx = mfi.growntilebox(nGrow);
                Array4<Real> const& crsearr = crse_S_fine.array(mfi);
                Array4<Real const> const& finearr = S_fine.const_array(mfi);

                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                {
                    amrex_avgdown(i,j,k,n,crsearr,finearr,0,scomp,ratio);
                });
            }
        }

        S_crse.ParallelCopy(crse_S_fine, 0, scomp, ncomp, nGrow, 0,
                            cgeom.periodicity(), FabArrayBase::ADD);
    }